

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution_x86::forwardDilation_x86
          (Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  size_t _elemsize;
  size_t sVar7;
  void *pvVar8;
  size_t sVar9;
  Layer *pLVar10;
  int iVar11;
  int iVar12;
  int *piVar13;
  int j;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  void *pvVar17;
  int _w;
  int iVar18;
  int _w_00;
  ulong uVar19;
  ulong uVar20;
  undefined4 *puVar21;
  int iVar22;
  void *pvVar23;
  ulong uVar24;
  undefined4 *puVar25;
  int j_1;
  long lVar26;
  int _w_01;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  undefined4 *puVar30;
  long local_1c8;
  long local_1c0;
  long local_180;
  long local_160;
  Mat local_118;
  Mat local_c8;
  Option opt_g;
  
  iVar1 = bottom_blob->w;
  iVar2 = bottom_blob->h;
  _elemsize = bottom_blob->elemsize;
  iVar3 = (this->super_Convolution).kernel_w;
  iVar4 = (this->super_Convolution).stride_w;
  uVar5 = (this->super_Convolution).dilation_w;
  iVar18 = (iVar3 + -1) * uVar5 + 1;
  iVar11 = (iVar1 - iVar18) / iVar4;
  _w = iVar11 + 1;
  Mat::create(top_blob,_w,(iVar2 - iVar18) / iVar4 + 1,(this->super_Convolution).num_output,
              _elemsize,opt->blob_allocator);
  iVar18 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    local_c8.cstep = 0;
    local_c8.data = (void *)0x0;
    local_c8.refcount._0_4_ = 0;
    local_c8.refcount._4_4_ = 0;
    local_c8.elemsize._0_4_ = 0;
    local_c8.elemsize._4_4_ = 0;
    local_c8.elempack = 0;
    local_118.cstep = 0;
    local_c8.allocator = (Allocator *)0x0;
    local_c8.dims = 0;
    local_c8.w = 0;
    local_c8.h = 0;
    local_c8.d = 0;
    local_c8.c = 0;
    uVar19 = 0;
    if (0 < (int)uVar5) {
      uVar19 = (ulong)uVar5;
    }
    local_118.data = (void *)0x0;
    local_118.refcount._0_4_ = 0;
    local_118.refcount._4_4_ = 0;
    local_118.elemsize._0_4_ = 0;
    local_118.elemsize._4_4_ = 0;
    local_118.elempack = 0;
    local_118.allocator = (Allocator *)0x0;
    local_118.dims = 0;
    local_118.w = 0;
    local_118.h = 0;
    local_118.d = 0;
    local_118.c = 0;
    local_1c0 = 0;
    local_1c8 = 0;
    for (uVar16 = 0; uVar16 != uVar19; uVar16 = uVar16 + 1) {
      local_180 = local_1c0;
      local_160 = local_1c8;
      for (uVar15 = 0; uVar15 != uVar5; uVar15 = uVar15 + 1) {
        uVar27 = (long)(int)((uVar5 + iVar1 + -1) - (int)uVar15) / (long)(int)uVar5;
        uVar29 = (long)(int)((uVar5 + iVar2 + -1) - (int)uVar16) / (long)(int)uVar5;
        _w_01 = (int)uVar27;
        iVar18 = (_w_01 - iVar3) / iVar4;
        iVar22 = (int)uVar29;
        iVar12 = (iVar22 - iVar3) / iVar4;
        Mat::create(&local_c8,_w_01,iVar22,bottom_blob->c,_elemsize,opt->workspace_allocator);
        if ((local_c8.data == (void *)0x0) || ((long)local_c8.c * local_c8.cstep == 0)) {
LAB_001667fd:
          iVar18 = -100;
          goto LAB_00166800;
        }
        _w_00 = iVar18 + 1;
        Mat::create(&local_118,_w_00,iVar12 + 1,(this->super_Convolution).num_output,_elemsize,
                    opt->workspace_allocator);
        if ((local_118.data == (void *)0x0) || ((long)local_118.c * local_118.cstep == 0))
        goto LAB_001667fd;
        uVar27 = uVar27 & 0xffffffff;
        if (_w_01 < 1) {
          uVar27 = 0;
        }
        uVar29 = uVar29 & 0xffffffff;
        if (iVar22 < 1) {
          uVar29 = 0;
        }
        uVar6 = bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar6 = 0;
        }
        pvVar17 = local_c8.data;
        for (uVar20 = 0; uVar20 != uVar6; uVar20 = uVar20 + 1) {
          sVar7 = bottom_blob->cstep;
          pvVar8 = bottom_blob->data;
          sVar9 = bottom_blob->elemsize;
          iVar22 = 0;
          pvVar23 = pvVar17;
          for (uVar24 = 0; uVar24 != uVar29; uVar24 = uVar24 + 1) {
            puVar21 = (undefined4 *)
                      ((long)pvVar8 + (long)iVar22 * 4 + sVar7 * sVar9 * uVar20 + local_160);
            for (uVar14 = 0; uVar27 != uVar14; uVar14 = uVar14 + 1) {
              *(undefined4 *)((long)pvVar23 + uVar14 * 4) = *puVar21;
              puVar21 = puVar21 + (int)uVar5;
            }
            pvVar23 = (void *)((long)pvVar23 + (long)_w_01 * 4);
            iVar22 = iVar22 + uVar5 * iVar1;
          }
          pvVar17 = (void *)((long)pvVar17 +
                            local_c8.cstep *
                            CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
        }
        opt_g.lightmode = opt->lightmode;
        opt_g.use_shader_pack8 = opt->use_shader_pack8;
        opt_g.use_subgroup_ops = opt->use_subgroup_ops;
        opt_g.use_reserved_0 = opt->use_reserved_0;
        opt_g.num_threads = opt->num_threads;
        opt_g.workspace_allocator._0_4_ = *(undefined4 *)&opt->workspace_allocator;
        opt_g.workspace_allocator._4_4_ = *(undefined4 *)((long)&opt->workspace_allocator + 4);
        opt_g.openmp_blocktime = opt->openmp_blocktime;
        opt_g.use_winograd_convolution = opt->use_winograd_convolution;
        opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
        opt_g.use_int8_inference = opt->use_int8_inference;
        opt_g.use_vulkan_compute = opt->use_vulkan_compute;
        opt_g.use_bf16_storage = opt->use_bf16_storage;
        opt_g.use_fp16_packed = opt->use_fp16_packed;
        opt_g.use_fp16_storage = opt->use_fp16_storage;
        opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
        opt_g.use_int8_packed = opt->use_int8_packed;
        opt_g.use_int8_storage = opt->use_int8_storage;
        opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
        opt_g.use_packing_layout = opt->use_packing_layout;
        opt_g.vulkan_device_index = opt->vulkan_device_index;
        opt_g.use_reserved_1 = opt->use_reserved_1;
        opt_g.use_image_storage = opt->use_image_storage;
        opt_g.use_tensor_storage = opt->use_tensor_storage;
        opt_g.use_reserved_2 = opt->use_reserved_2;
        opt_g.flush_denormals = opt->flush_denormals;
        opt_g.use_local_pool_allocator = opt->use_local_pool_allocator;
        opt_g.use_shader_local_memory = opt->use_shader_local_memory;
        opt_g.use_cooperative_matrix = opt->use_cooperative_matrix;
        opt_g.use_winograd23_convolution = opt->use_winograd23_convolution;
        opt_g.use_winograd43_convolution = opt->use_winograd43_convolution;
        opt_g.use_winograd63_convolution = opt->use_winograd63_convolution;
        opt_g.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
        opt_g.use_fp16_uniform = opt->use_fp16_uniform;
        opt_g.use_int8_uniform = opt->use_int8_uniform;
        opt_g.use_reserved_9 = opt->use_reserved_9;
        opt_g.use_reserved_10 = opt->use_reserved_10;
        opt_g.use_reserved_11 = opt->use_reserved_11;
        opt_g.blob_allocator = local_118.allocator;
        (*this->convolution_dilation1->_vptr_Layer[7])
                  (this->convolution_dilation1,&local_c8,&local_118,&opt_g);
        uVar6 = (this->super_Convolution).num_output;
        sVar7 = top_blob->cstep;
        uVar27 = (ulong)uVar6;
        if ((int)uVar6 < 1) {
          uVar27 = 0;
        }
        puVar21 = (undefined4 *)((long)top_blob->data + local_180);
        sVar9 = top_blob->elemsize;
        for (uVar29 = 0; uVar29 != uVar27; uVar29 = uVar29 + 1) {
          pvVar17 = (void *)(local_118.cstep *
                             CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize) *
                             uVar29 + (long)local_118.data);
          puVar25 = puVar21;
          for (lVar28 = 0; lVar28 <= iVar12; lVar28 = lVar28 + 1) {
            puVar30 = puVar25;
            for (lVar26 = 0; lVar26 <= iVar18; lVar26 = lVar26 + 1) {
              *puVar30 = *(undefined4 *)((long)pvVar17 + lVar26 * 4);
              puVar30 = puVar30 + (int)uVar5;
            }
            pvVar17 = (void *)((long)pvVar17 + (long)_w_00 * 4);
            puVar25 = puVar25 + (int)(_w * uVar5);
          }
          puVar21 = (undefined4 *)((long)puVar21 + sVar7 * sVar9);
        }
        local_160 = local_160 + 4;
        local_180 = local_180 + 4;
      }
      local_1c8 = local_1c8 + (long)iVar1 * 4;
      local_1c0 = local_1c0 + (long)iVar11 * 4 + 4;
    }
    pLVar10 = this->activation;
    iVar18 = 0;
    if (pLVar10 != (Layer *)0x0) {
      (*pLVar10->_vptr_Layer[9])(pLVar10,top_blob,opt);
      iVar18 = 0;
    }
LAB_00166800:
    piVar13 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        if (local_118.allocator == (Allocator *)0x0) {
          free(local_118.data);
        }
        else {
          (*(local_118.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar13 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          free(local_c8.data);
        }
        else {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return iVar18;
}

Assistant:

int Convolution_x86::forwardDilation_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_size = kernel_w;
    const int stride = stride_w;
    const int dilation = dilation_w;
    const int kernel_extent = dilation * (kernel_size - 1) + 1;

    int outw = (w - kernel_extent) / stride + 1;
    int outh = (h - kernel_extent) / stride + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Make (dilation * dilation) batches
    Mat inner_bottom_blob;
    Mat inner_top_blob;
    for (int x = 0; x < dilation; x++)
    {
        for (int y = 0; y < dilation; y++)
        {
            int inner_w = (w - y + dilation - 1) / dilation;
            int inner_h = (h - x + dilation - 1) / dilation;

            int inner_outw = (inner_w - kernel_size) / stride + 1;
            int inner_outh = (inner_h - kernel_size) / stride + 1;

            inner_bottom_blob.create(inner_w, inner_h, bottom_blob.c, elemsize, opt.workspace_allocator);
            if (inner_bottom_blob.empty())
                return -100;

            inner_top_blob.create(inner_outw, inner_outh, num_output, elemsize, opt.workspace_allocator);
            if (inner_top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < bottom_blob.c; c++)
            {
                float* outptr = inner_bottom_blob.channel(c);

                for (int i = 0; i < inner_h; i++)
                {
                    const float* ptr = (const float*)bottom_blob.channel(c) + dilation * i * w + x * w + y;
                    for (int j = 0; j < inner_w; j++)
                    {
                        outptr[j] = ptr[j * dilation];
                    }
                    outptr += inner_w;
                }
            }

            Option opt_g = opt;
            opt_g.blob_allocator = inner_top_blob.allocator;
            convolution_dilation1->forward(inner_bottom_blob, inner_top_blob, opt_g);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < num_output; c++)
            {
                float* outptr = (float*)top_blob.channel(c) + x * outw + y;
                for (int i = 0; i < inner_outh; i++)
                {
                    const float* ptr = (const float*)inner_top_blob.channel(c) + i * inner_outw;
                    for (int j = 0; j < inner_outw; j++)
                    {
                        outptr[j * dilation] = ptr[j];
                    }
                    outptr += dilation * outw;
                }
            }
        }
    }

    if (activation)
    {
        activation->forward_inplace(top_blob, opt);
    }

    return 0;
}